

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void phsubd_(PDISASM pMyDisasm)

{
  _Bool _Var1;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
LAB_00122bf3:
    failDecode(pMyDisasm);
    return;
  }
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp != '\x01') goto LAB_00122bf3;
    (pMyDisasm->Instruction).Category = 0x110002;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vphsubd",8);
    ArgsVEX(pMyDisasm);
  }
  else {
    if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Instruction).Category = 0x70002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"phsubd",7);
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Reserved_).Register_ = 4;
    }
    else {
      _Var1 = prefixes_present(pMyDisasm);
      if (_Var1) goto LAB_00122bf3;
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      (pMyDisasm->Instruction).Category = 0x70002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"phsubd",7);
      (pMyDisasm->Reserved_).Register_ = 2;
    }
    GxEx(pMyDisasm);
  }
  (pMyDisasm->Operand1).AccessMode = 3;
  return;
}

Assistant:

void __bea_callspec__ phsubd_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  } else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      pMyDisasm->Instruction.Category = AVX_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vphsubd");
      #endif
      ArgsVEX(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    GV.OperandSize = GV.OriginalOperandSize;
    pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
    pMyDisasm->Instruction.Category = SSSE3_INSTRUCTION+ARITHMETIC_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "phsubd");
    #endif
    GV.MemDecoration = Arg2_m128_xmm;
    GV.Register_ = SSE_REG;
    GxEx(pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ + WRITE;
  }
  else {
    if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
    GV.MemDecoration = Arg2qword;
    pMyDisasm->Instruction.Category = SSSE3_INSTRUCTION+ARITHMETIC_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "phsubd");
    #endif
    GV.Register_ = MMX_REG;
    GxEx(pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ + WRITE;
  }
}